

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

void __thiscall ON_Mesh::Flip(ON_Mesh *this)

{
  FlipFaceOrientation(this);
  FlipFaceNormals(this);
  FlipVertexNormals(this);
  FlipNgonOrientation(this);
  return;
}

Assistant:

void 
ON_Mesh::Flip()
{
  FlipFaceOrientation();
  FlipFaceNormals();
  FlipVertexNormals();
  FlipNgonOrientation();

  // Do not modify m_S[] or m_T[]
  // values here.
}